

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_newarray(HSQUIRRELVM v,SQInteger size)

{
  SQArray *x;
  SQSharedState *in_RDI;
  SQInteger in_stack_ffffffffffffffb8;
  SQObjectPtr *this;
  SQVM *in_stack_ffffffffffffffd0;
  SQObjectPtr local_20 [2];
  
  x = SQArray::Create(in_RDI,in_stack_ffffffffffffffb8);
  this = local_20;
  SQObjectPtr::SQObjectPtr(this,x);
  SQVM::Push(in_stack_ffffffffffffffd0,this);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  return;
}

Assistant:

void sq_newarray(HSQUIRRELVM v,SQInteger size)
{
    v->Push(SQArray::Create(_ss(v), size));
}